

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::DeadBranchElimPass::FindFirstExitFromSelectionMerge
          (DeadBranchElimPass *this,uint32_t start_block_id,uint32_t merge_block_id,
          uint32_t loop_merge_id,uint32_t loop_continue_id,uint32_t switch_merge_id)

{
  Op OVar1;
  uint32_t uVar2;
  BasicBlock *this_00;
  Instruction *this_01;
  uint32_t i;
  uint32_t uVar3;
  bool bVar4;
  int iVar5;
  
  do {
    do {
      while( true ) {
        while( true ) {
          if ((start_block_id == loop_continue_id) || (start_block_id == merge_block_id)) {
            return (Instruction *)0x0;
          }
          if (start_block_id == loop_merge_id) {
            return (Instruction *)0x0;
          }
          this_00 = IRContext::get_instr_block
                              ((this->super_MemPass).super_Pass.context_,start_block_id);
          this_01 = BasicBlock::terminator(this_00);
          OVar1 = this_01->opcode_;
          if (OVar1 != OpBranch) break;
          start_block_id = BasicBlock::MergeBlockIdIfAny(this_00);
          if (start_block_id == 0) {
            start_block_id = Instruction::GetSingleWordInOperand(this_01,0);
          }
        }
        if (OVar1 != OpSwitch) break;
        start_block_id = BasicBlock::MergeBlockIdIfAny(this_00);
        if (start_block_id == 0) {
          start_block_id = 0;
          bVar4 = false;
          for (uVar2 = 1; uVar3 = Instruction::NumInOperands(this_01), uVar2 < uVar3;
              uVar2 = uVar2 + 2) {
            uVar3 = Instruction::GetSingleWordInOperand(this_01,uVar2);
            if (uVar3 == merge_block_id) {
              bVar4 = true;
            }
            else if (uVar3 != loop_continue_id && uVar3 != loop_merge_id) {
              start_block_id = Instruction::GetSingleWordInOperand(this_01,uVar2);
            }
          }
          if (start_block_id == 0 || bVar4) {
            if (start_block_id == 0) {
              this_01 = (Instruction *)0x0;
            }
            return this_01;
          }
        }
      }
      if (OVar1 != OpBranchConditional) {
        return (Instruction *)0x0;
      }
      start_block_id = BasicBlock::MergeBlockIdIfAny(this_00);
    } while (start_block_id != 0);
    iVar5 = -2;
    while( true ) {
      if (iVar5 == 0) {
        return this_01;
      }
      uVar3 = iVar5 + 3;
      uVar2 = Instruction::GetSingleWordInOperand(this_01,uVar3);
      if ((((loop_merge_id != merge_block_id) && (uVar2 == loop_merge_id)) ||
          ((uVar2 = Instruction::GetSingleWordInOperand(this_01,uVar3),
           loop_continue_id != merge_block_id && (uVar2 == loop_continue_id)))) ||
         ((uVar2 = Instruction::GetSingleWordInOperand(this_01,uVar3),
          switch_merge_id != merge_block_id && (uVar2 == switch_merge_id)))) break;
      iVar5 = iVar5 + 1;
    }
    start_block_id = Instruction::GetSingleWordInOperand(this_01,-iVar5);
  } while (start_block_id != 0);
  return this_01;
}

Assistant:

Instruction* DeadBranchElimPass::FindFirstExitFromSelectionMerge(
    uint32_t start_block_id, uint32_t merge_block_id, uint32_t loop_merge_id,
    uint32_t loop_continue_id, uint32_t switch_merge_id) {
  // To find the "first" exit, we follow branches looking for a conditional
  // branch that is not in a nested construct and is not the header of a new
  // construct.  We follow the control flow from |start_block_id| to find the
  // first one.

  while (start_block_id != merge_block_id && start_block_id != loop_merge_id &&
         start_block_id != loop_continue_id) {
    BasicBlock* start_block = context()->get_instr_block(start_block_id);
    Instruction* branch = start_block->terminator();
    uint32_t next_block_id = 0;
    switch (branch->opcode()) {
      case spv::Op::OpBranchConditional:
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          // If a possible target is the |loop_merge_id| or |loop_continue_id|,
          // which are not the current merge node, then we continue the search
          // with the other target.
          for (uint32_t i = 1; i < 3; i++) {
            if (branch->GetSingleWordInOperand(i) == loop_merge_id &&
                loop_merge_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
            if (branch->GetSingleWordInOperand(i) == loop_continue_id &&
                loop_continue_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
            if (branch->GetSingleWordInOperand(i) == switch_merge_id &&
                switch_merge_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
          }

          if (next_block_id == 0) {
            return branch;
          }
        }
        break;
      case spv::Op::OpSwitch:
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          // A switch with no merge instructions can have at most 5 targets:
          //   a. |merge_block_id|
          //   b. |loop_merge_id|
          //   c. |loop_continue_id|
          //   d. |switch_merge_id|
          //   e. 1 block inside the current region.
          //
          // Note that because this is a switch, |merge_block_id| must equal
          // |switch_merge_id|.
          //
          // This leads to a number of cases of what to do.
          //
          // 1. Does not jump to a block inside of the current construct.  In
          // this case, there is not conditional break, so we should return
          // |nullptr|.
          //
          // 2. Jumps to |merge_block_id| and a block inside the current
          // construct.  In this case, this branch conditionally break to the
          // end of the current construct, so return the current branch.
          //
          // 3.  Otherwise, this branch may break, but not to the current merge
          // block.  So we continue with the block that is inside the loop.
          bool found_break = false;
          for (uint32_t i = 1; i < branch->NumInOperands(); i += 2) {
            uint32_t target = branch->GetSingleWordInOperand(i);
            if (target == merge_block_id) {
              found_break = true;
            } else if (target != loop_merge_id && target != loop_continue_id) {
              next_block_id = branch->GetSingleWordInOperand(i);
            }
          }

          if (next_block_id == 0) {
            // Case 1.
            return nullptr;
          }

          if (found_break) {
            // Case 2.
            return branch;
          }

          // The fall through is case 3.
        }
        break;
      case spv::Op::OpBranch:
        // Need to check if this is the header of a loop nested in the
        // selection construct.
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          next_block_id = branch->GetSingleWordInOperand(0);
        }
        break;
      default:
        return nullptr;
    }
    start_block_id = next_block_id;
  }
  return nullptr;
}